

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O1

void psh_hint_table_activate_mask(PSH_Hint_Table table,PS_Mask hint_mask)

{
  uint uVar1;
  int iVar2;
  PSH_Hint_conflict pPVar3;
  PSH_Hint_conflict *ppPVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  FT_UInt *pFVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  
  pbVar5 = hint_mask->bytes;
  uVar7 = hint_mask->num_bits;
  uVar12 = table->max_hints;
  if (uVar12 != 0) {
    pFVar8 = &table->hints->flags;
    uVar9 = uVar12;
    do {
      *(byte *)pFVar8 = (byte)*pFVar8 & 0xfb;
      pFVar8[4] = -1;
      pFVar8 = pFVar8 + 0xc;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if ((ulong)uVar7 == 0) {
    uVar9 = 0;
  }
  else {
    lVar10 = 0;
    uVar14 = 0;
    uVar11 = 0;
    uVar9 = 0;
    do {
      if (uVar14 == 0) {
        uVar11 = (uint)*pbVar5;
        pbVar5 = pbVar5 + 1;
        uVar14 = 0x80;
      }
      if ((uVar14 & uVar11) != 0) {
        pPVar3 = table->hints;
        uVar1 = *(uint *)((long)&pPVar3->flags + lVar10);
        if (((uVar1 & 4) == 0) &&
           (*(uint *)((long)&pPVar3->flags + lVar10) = uVar1 | 4, uVar9 < uVar12)) {
          uVar6 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          table->sort[uVar6] = (PSH_Hint_conflict)((long)&pPVar3->org_pos + lVar10);
        }
      }
      uVar14 = uVar14 >> 1;
      lVar10 = lVar10 + 0x30;
    } while ((ulong)uVar7 * 0x30 != lVar10);
  }
  table->num_hints = uVar9;
  if (1 < uVar9) {
    ppPVar4 = table->sort;
    uVar6 = 1;
    uVar7 = 0xffffffff;
    do {
      pPVar3 = ppPVar4[uVar6];
      iVar2 = pPVar3->org_pos;
      uVar12 = uVar7;
      do {
        uVar13 = (ulong)uVar12;
        if (ppPVar4[uVar12 + 1]->org_pos < iVar2) break;
        ppPVar4[uVar12 + 2] = ppPVar4[uVar12 + 1];
        ppPVar4[uVar12 + 1] = pPVar3;
        uVar12 = uVar12 - 1;
      } while (uVar13 < uVar6);
      uVar6 = uVar6 + 1;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar9);
  }
  return;
}

Assistant:

static void
  psh_hint_table_activate_mask( PSH_Hint_Table  table,
                                PS_Mask         hint_mask )
  {
    FT_Int    mask = 0, val = 0;
    FT_Byte*  cursor = hint_mask->bytes;
    FT_UInt   idx, limit, count;


    limit = hint_mask->num_bits;
    count = 0;

    psh_hint_table_deactivate( table );

    for ( idx = 0; idx < limit; idx++ )
    {
      if ( mask == 0 )
      {
        val  = *cursor++;
        mask = 0x80;
      }

      if ( val & mask )
      {
        PSH_Hint  hint = &table->hints[idx];


        if ( !psh_hint_is_active( hint ) )
        {
          FT_UInt     count2;

#if 0
          PSH_Hint*  sort = table->sort;
          PSH_Hint   hint2;


          for ( count2 = count; count2 > 0; count2--, sort++ )
          {
            hint2 = sort[0];
            if ( psh_hint_overlap( hint, hint2 ) )
              FT_TRACE0(( "psh_hint_table_activate_mask:"
                          " found overlapping hints\n" ))
          }
#else
          count2 = 0;
#endif

          if ( count2 == 0 )
          {
            psh_hint_activate( hint );
            if ( count < table->max_hints )
              table->sort[count++] = hint;
            else
              FT_TRACE0(( "psh_hint_tableactivate_mask:"
                          " too many active hints\n" ));
          }
        }
      }

      mask >>= 1;
    }
    table->num_hints = count;

    /* now, sort the hints; they are guaranteed to not overlap */
    /* so we can compare their "org_pos" field directly        */
    {
      FT_UInt    i1, i2;
      PSH_Hint   hint1, hint2;
      PSH_Hint*  sort = table->sort;


      /* a simple bubble sort will do, since in 99% of cases, the hints */
      /* will be already sorted -- and the sort will be linear          */
      for ( i1 = 1; i1 < count; i1++ )
      {
        hint1 = sort[i1];
        /* this loop stops when i2 wraps around after reaching 0 */
        for ( i2 = i1 - 1; i2 < i1; i2-- )
        {
          hint2 = sort[i2];

          if ( hint2->org_pos < hint1->org_pos )
            break;

          sort[i2 + 1] = hint2;
          sort[i2]     = hint1;
        }
      }
    }
  }